

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_InsertValue_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *expression_text;
  AssertionResult *assertion_result;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *pcVar2;
  reference __x;
  bool *lhs;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  long in_RDI;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_3;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  insert_it;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffae8;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaf0;
  bool *in_stack_fffffffffffffaf8;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  int line;
  char *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  Type type;
  AssertHelper *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  AssertionResult *in_stack_fffffffffffffb68;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb70;
  string local_470 [52];
  value_type local_43c;
  undefined1 local_431;
  AssertionResult local_430 [2];
  undefined1 local_409;
  AssertionResult local_408;
  value_type local_3f8;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_3f0;
  string local_3c8 [52];
  value_type local_394;
  undefined1 local_389;
  AssertionResult local_388 [2];
  undefined1 local_361;
  AssertionResult local_360;
  value_type local_350;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_348;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_320;
  key_type local_2e4;
  size_type local_2e0;
  undefined4 local_2d4;
  AssertionResult local_2d0 [2];
  key_type local_2ac;
  size_type local_2a8;
  undefined4 local_29c;
  AssertionResult local_298 [2];
  size_type local_278;
  undefined4 local_26c;
  AssertionResult local_268 [3];
  value_type local_230;
  value_type local_200;
  value_type local_1d0;
  value_type local_1a0;
  value_type local_170;
  value_type local_140;
  value_type local_110;
  value_type local_e0;
  string local_d8 [55];
  byte local_a1;
  AssertionResult local_a0 [3];
  value_type local_68;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe15d98);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffaf0,(bool *)in_stack_fffffffffffffae8,
             (type *)0xe15dba);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,type,in_stack_fffffffffffffb10,
               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb70,(Message *)in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xe15e7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe15f12);
  local_68 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe15f69);
  local_a1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffaf0,(bool *)in_stack_fffffffffffffae8,
             (type *)0xe15f8d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,type,in_stack_fffffffffffffb10,
               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb70,(Message *)in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0xe16060);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe160f7);
  local_e0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  local_110 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  expected_predicate_value = (char *)(in_RDI + 0x10);
  local_140 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  actual_predicate_value = (char *)(in_RDI + 0x10);
  local_170 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  expression_text = (char *)(in_RDI + 0x10);
  local_1a0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  local_1d0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb70,(value_type *)assertion_result);
  this_00 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_200 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  local_230 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  local_26c = 9;
  local_278 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe16325);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,
             (uint *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::AssertionResult::failure_message((AssertionResult *)0xe1639e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,type,in_stack_fffffffffffffb10,
               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0xe163fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe1646c);
  local_29c = 1;
  local_2ac = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb00,(int)((ulong)in_stack_fffffffffffffaf8 >> 0x20))
  ;
  local_2a8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,
             (uint *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::AssertionResult::failure_message((AssertionResult *)0xe16527);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,type,in_stack_fffffffffffffb10,
               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0xe16584);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe165f5);
  local_2d4 = 1;
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_2e4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb00,(int)((ulong)in_stack_fffffffffffffaf8 >> 0x20))
  ;
  local_2e0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffffaf0,(key_type *)in_stack_fffffffffffffae8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,
             (uint *)in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xe166b0);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,in_stack_fffffffffffffb10,
               (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0xe1670d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe1677e);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)in_stack_fffffffffffffaf0);
  pcVar2 = (char *)(in_RDI + 0x10);
  local_350 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=(&local_320,&local_348);
  local_361 = 0;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffffb08,(char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             (bool *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffb08 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe1685d);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar2,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
               (char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0xe168ba);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe1692b);
  __x = google::
        dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        ::operator*((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                     *)&local_320);
  local_394 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  local_389 = std::operator==(__x,&local_394);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffaf0,(bool *)in_stack_fffffffffffffae8,
             (type *)0xe1698b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar2,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(char *)__x);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    std::__cxx11::string::~string(local_3c8);
    testing::Message::~Message((Message *)0xe16a5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe16af5);
  lhs = (bool *)(in_RDI + 0x10);
  local_3f8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffae8,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=(&local_320,&local_3f0);
  local_409 = 1;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffffb08,(char *)__x,lhs,(bool *)in_stack_fffffffffffffaf0);
  line = (int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffaf0 =
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe16bc7);
    testing::internal::AssertHelper::AssertHelper(this_01,type,pcVar2,line,(char *)__x);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0xe16c24);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe16c95);
  this_02 = (HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator*((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_320);
  local_43c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(this_02,0);
  local_431 = std::operator==((pair<const_int,_int> *)this_02,&local_43c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffaf0,(bool *)this_02,(type *)0xe16cf3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,pcVar2,line,(char *)__x);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    std::__cxx11::string::~string(local_470);
    testing::Message::~Message((Message *)0xe16dc6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe16e54);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}